

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  pointer pTVar3;
  pointer pEVar4;
  ExprList *this_00;
  reference pvVar5;
  pointer pTVar6;
  size_type sVar7;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_238;
  Enum local_230;
  Enum local_22c;
  undefined1 local_228 [8];
  __single_object field_1;
  undefined1 local_210 [8];
  __single_object table_field;
  ExprList elem_expr;
  Const local_1c8;
  undefined1 local_178 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_170;
  Location local_168;
  Var local_148;
  ElemSegment *local_100;
  ElemSegment *elem_segment;
  __single_object elem_segment_field;
  Type local_e0;
  Type elem_type;
  Location local_d0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_b0;
  __single_object field;
  undefined1 local_98 [8];
  __single_object import;
  ModuleFieldList export_fields;
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  RVar2 = Expect(this,Table);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)&export_fields.size_);
  ParseBindVarOpt(this,(string *)&export_fields.size_);
  intrusive_list<wabt::ModuleField>::intrusive_list
            ((intrusive_list<wabt::ModuleField> *)&stack0xffffffffffffff78);
  import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t
  .super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
  super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._4_4_ =
       ParseInlineExports(this,(ModuleFieldList *)&stack0xffffffffffffff78,Table);
  bVar1 = Failed(import._M_t.
                 super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>
                 .super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
    super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    goto LAB_001972cc;
  }
  bVar1 = PeekMatchLpar(this,Import);
  if (bVar1) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::TableImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::get
                       ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                        local_98);
    RVar2 = ParseInlineImport(this,(Import *)pTVar3);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::
               operator->((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                          local_98);
      RVar2 = ParseLimits(this,&(pTVar3->table).elem_limits);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::
                 operator->((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>
                             *)local_98);
        field._M_t.
        super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_ =
             ParseRefType(this,&(pTVar3->table).elem_type);
        bVar1 = Failed(field._M_t.
                       super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          GetLocation(&local_d0,this);
          std::
          make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
                    ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                     &local_b0,(Location *)local_98);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                      *)&elem_type,&local_b0);
          Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                      *)&elem_type);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          ~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                       *)&elem_type);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          ~unique_ptr(&local_b0);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 0;
        }
      }
    }
    std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::~unique_ptr
              ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)local_98);
  }
  else {
    bVar1 = PeekMatch(this,First_Type,0);
    if (bVar1) {
      RVar2 = ParseRefType(this,&local_e0);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        goto LAB_001972cc;
      }
      RVar2 = Expect(this,Lpar);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        goto LAB_001972cc;
      }
      elem_segment_field._M_t.
      super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
      .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl._4_4_ =
           Expect(this,Elem);
      bVar1 = Failed(elem_segment_field._M_t.
                     super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                     .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl.
                     _4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        goto LAB_001972cc;
      }
      std::make_unique<wabt::ElemSegmentModuleField,wabt::Location&>((Location *)&elem_segment);
      pEVar4 = std::
               unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
               ::operator->((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                             *)&elem_segment);
      local_100 = &pEVar4->elem_segment;
      sVar7 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&module->tables);
      GetLocation(&local_168,this);
      Var::Var(&local_148,(Index)sVar7,&local_168);
      Var::operator=(&local_100->table_var,&local_148);
      Var::~Var(&local_148);
      this_00 = &local_100->offset;
      Location::Location((Location *)&elem_expr.size_);
      Const::I32(&local_1c8,0,(Location *)&elem_expr.size_);
      std::make_unique<wabt::ConstExpr,wabt::Const>((Const *)local_178);
      std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
      unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
                ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_170,
                 (unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> *)local_178);
      intrusive_list<wabt::Expr>::push_back(this_00,&local_170);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_170);
      std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr
                ((unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> *)local_178);
      pvVar5 = intrusive_list<wabt::Expr>::back(&local_100->offset);
      (pvVar5->loc).filename._M_len = (size_t)local_48;
      (pvVar5->loc).filename._M_str = (char *)loc.filename._M_len;
      (pvVar5->loc).field_1.field_1.offset = (size_t)loc.filename._M_str;
      ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
      ((long)&(pvVar5->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
      local_100->elem_type = local_e0;
      intrusive_list<wabt::Expr>::intrusive_list
                ((intrusive_list<wabt::Expr> *)&stack0xfffffffffffffe00);
      bVar1 = ParseElemExprOpt(this,(ExprList *)&stack0xfffffffffffffe00);
      if (bVar1) {
        std::
        vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
        ::push_back(&local_100->elem_exprs,(value_type *)&stack0xfffffffffffffe00);
        ParseElemExprListOpt(this,&local_100->elem_exprs);
      }
      else {
        ParseElemExprVarListOpt(this,&local_100->elem_exprs);
      }
      table_field._M_t.
      super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>.
      _M_t.
      super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
      .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl._4_4_ = Expect(this,Rpar)
      ;
      bVar1 = Failed(table_field._M_t.
                     super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                     .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        std::make_unique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                  ((Location *)local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
        sVar7 = std::
                vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                ::size(&local_100->elem_exprs);
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                             *)local_210);
        (pTVar6->table).elem_limits.initial = sVar7;
        sVar7 = std::
                vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                ::size(&local_100->elem_exprs);
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                             *)local_210);
        (pTVar6->table).elem_limits.max = sVar7;
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                             *)local_210);
        (pTVar6->table).elem_limits.has_max = true;
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                             *)local_210);
        (pTVar6->table).elem_type = local_e0;
        std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
        unique_ptr((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                    *)&stack0xfffffffffffffde8,
                   (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                    *)local_210);
        Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                    *)&stack0xfffffffffffffde8);
        std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
        ~unique_ptr((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                     *)&stack0xfffffffffffffde8);
        std::
        unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
        ::unique_ptr((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      *)&field_1,
                     (unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      *)&elem_segment);
        Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                    *)&field_1);
        std::
        unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
        ::~unique_ptr((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                       *)&field_1);
        std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
        ~unique_ptr((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                     *)local_210);
      }
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._1_3_ = 0;
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_1_ = bVar1;
      intrusive_list<wabt::Expr>::~intrusive_list
                ((intrusive_list<wabt::Expr> *)&stack0xfffffffffffffe00);
      std::
      unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>::
      ~unique_ptr((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                   *)&elem_segment);
    }
    else {
      std::make_unique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((Location *)local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      pTVar6 = std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
               ::operator->((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                             *)local_228);
      local_22c = (Enum)ParseLimits(this,&(pTVar6->table).elem_limits);
      bVar1 = Failed((Result)local_22c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                             *)local_228);
        local_230 = (Enum)ParseRefType(this,&(pTVar6->table).elem_type);
        bVar1 = Failed((Result)local_230);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
          unique_ptr(&local_238,
                     (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                      *)local_228);
          Module::AppendField(module,&local_238);
          std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
          ~unique_ptr(&local_238);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 0;
        }
      }
      std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
      ~unique_ptr((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                   *)local_228);
    }
  }
  if ((uint)import._M_t.
            super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
            super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl == 0) {
    sVar7 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&module->tables);
    anon_unknown_1::AppendInlineExportFields
              (module,(ModuleFieldList *)&stack0xffffffffffffff78,(int)sVar7 - 1);
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
LAB_001972cc:
  intrusive_list<wabt::ModuleField>::~intrusive_list
            ((intrusive_list<wabt::ModuleField> *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)&export_fields.size_);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (PeekMatch(TokenType::ValueType)) {
    Type elem_type;
    CHECK_RESULT(ParseRefType(&elem_type));

    EXPECT(Lpar);
    EXPECT(Elem);

    auto elem_segment_field = std::make_unique<ElemSegmentModuleField>(loc);
    ElemSegment& elem_segment = elem_segment_field->elem_segment;
    elem_segment.table_var = Var(module->tables.size(), GetLocation());
    elem_segment.offset.push_back(std::make_unique<ConstExpr>(Const::I32(0)));
    elem_segment.offset.back().loc = loc;
    elem_segment.elem_type = elem_type;
    // Syntax is either an optional list of var (legacy), or a non-empty list
    // of elem expr.
    ExprList elem_expr;
    if (ParseElemExprOpt(&elem_expr)) {
      elem_segment.elem_exprs.push_back(std::move(elem_expr));
      // Parse the rest.
      ParseElemExprListOpt(&elem_segment.elem_exprs);
    } else {
      ParseElemExprVarListOpt(&elem_segment.elem_exprs);
    }
    EXPECT(Rpar);

    auto table_field = std::make_unique<TableModuleField>(loc, name);
    table_field->table.elem_limits.initial = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.max = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.has_max = true;
    table_field->table.elem_type = elem_type;
    module->AppendField(std::move(table_field));
    module->AppendField(std::move(elem_segment_field));
  } else {
    auto field = std::make_unique<TableModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->table.elem_limits));
    CHECK_RESULT(ParseRefType(&field->table.elem_type));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}